

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void decrunch_backwards(int level,membuf *inbuf,membuf *outbuf)

{
  int iVar1;
  
  reverse_buffer((char *)inbuf->buf,inbuf->len);
  iVar1 = outbuf->len;
  decrunch(level,inbuf,outbuf);
  reverse_buffer((char *)inbuf->buf,inbuf->len);
  reverse_buffer((char *)((long)iVar1 + (long)outbuf->buf),outbuf->len - iVar1);
  return;
}

Assistant:

void decrunch_backwards(int level,
                        struct membuf *inbuf,
                        struct membuf *outbuf)
{
    int outpos;
    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    outpos = membuf_memlen(outbuf);

    decrunch(level, inbuf, outbuf);

    reverse_buffer(membuf_get(inbuf), membuf_memlen(inbuf));
    reverse_buffer((char*)membuf_get(outbuf) + outpos,
                   membuf_memlen(outbuf) - outpos);
}